

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_CreateRange(Cba_Ntk_t *p,int iFon,int NameId)

{
  int iVar1;
  
  iVar1 = Cba_NtkGetMap(p,NameId);
  if (iVar1 < 1) {
    Vec_IntSetEntry(&p->pDesign->vNameMap,NameId,0);
    Cba_NtkSetMap(p,NameId,iFon);
    if (iVar1 == 0) {
      return 1;
    }
    Cba_FonSetRangeSign(p,iFon,-iVar1);
    iVar1 = iFon;
  }
  iVar1 = Cba_FonRangeSize(p,iVar1);
  return iVar1;
}

Assistant:

int Prs_CreateRange( Cba_Ntk_t * p, int iFon, int NameId )
{
    int RangeId = -Cba_NtkGetMap(p, NameId);
    if ( RangeId < 0 ) // this variable is already created
        return Cba_FonRangeSize( p, -RangeId );
    Cba_NtkUnsetMap( p, NameId );
    Cba_NtkSetMap( p, NameId, iFon );
    if ( RangeId == 0 )
        return 1;
    assert( RangeId > 0 );
    Cba_FonSetRangeSign( p, iFon, RangeId );
    return Cba_FonRangeSize( p, iFon );
}